

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteSubProjects
          (cmGlobalGhsMultiGenerator *this,ostream *fout,string *all_target)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  pointer pcVar2;
  long lVar3;
  TargetType TVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  long *plVar8;
  long *plVar9;
  pointer ppcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_80;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  ostream *local_40;
  cmGlobalGhsMultiGenerator *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(fout,"CMakeFiles/",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(all_target->_M_dataplus)._M_p,all_target->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," [Project]",10);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  ppcVar10 = (this->ProjectTargets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar10 != ppcVar1) {
    local_40 = fout;
    local_38 = this;
    do {
      this_00 = *ppcVar10;
      TVar4 = cmGeneratorTarget::GetType(this_00);
      if (TVar4 != INTERFACE_LIBRARY) {
        TVar4 = cmGeneratorTarget::GetType(this_00);
        if (TVar4 != MODULE_LIBRARY) {
          TVar4 = cmGeneratorTarget::GetType(this_00);
          if (TVar4 != SHARED_LIBRARY) {
            TVar4 = cmGeneratorTarget::GetType(this_00);
            if (TVar4 == GLOBAL_TARGET) {
              psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              (*(local_38->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
              fout = local_40;
              iVar5 = std::__cxx11::string::compare((char *)psVar7);
              if (iVar5 != 0) goto LAB_0030f9d0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(fout,"CMakeFiles/",0xb);
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            pcVar2 = (psVar7->_M_dataplus)._M_p;
            local_60[0] = local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,pcVar2,pcVar2 + psVar7->_M_string_length);
            std::__cxx11::string::append((char *)local_60);
            plVar8 = (long *)std::__cxx11::string::append((char *)local_60);
            plVar9 = plVar8 + 2;
            if ((long *)*plVar8 == plVar9) {
              local_70 = *plVar9;
              lStack_68 = plVar8[3];
              local_80 = &local_70;
            }
            else {
              local_70 = *plVar9;
              local_80 = (long *)*plVar8;
            }
            lVar3 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)local_80,lVar3)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [Project]",10);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            if (local_80 != &local_70) {
              operator_delete(local_80,local_70 + 1);
            }
            if (local_60[0] != local_50) {
              operator_delete(local_60[0],local_50[0] + 1);
            }
          }
        }
      }
LAB_0030f9d0:
      ppcVar10 = ppcVar10 + 1;
    } while (ppcVar10 != ppcVar1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteSubProjects(std::ostream& fout,
                                                 std::string& all_target)
{
  fout << "CMakeFiles/" << all_target << " [Project]" << std::endl;
  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }
    fout << "CMakeFiles/" << target->GetName() + ".tgt" + FILE_EXTENSION
         << " [Project]" << std::endl;
  }
}